

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

uint64_t __thiscall
duckdb_jaro_winkler::common::BlockPatternMatchVector::get<char>
          (BlockPatternMatchVector *this,char key)

{
  BitvectorHashmap *this_00;
  uint64_t uVar1;
  uint64_t *puVar2;
  
  if (key < '\0') {
    this_00 = (this->m_map).
              super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = BitvectorHashmap::lookup(this_00,(long)key);
    puVar2 = &(this_00->m_map)._M_elems[uVar1].value;
  }
  else {
    puVar2 = (this->m_extendedAscii).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + (ulong)(byte)key * this->m_block_count;
  }
  return *puVar2;
}

Assistant:

uint64_t get(int64_t block, CharT key) const
    {
        assert(block < m_block_count);
        if (key >= 0 && key <= 255) {
            return m_extendedAscii[static_cast<size_t>(key * m_block_count + block)];
        }
        else {
            return m_map[static_cast<size_t>(block)].get(key);
        }
    }